

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O0

void send_tree(deflate_state *s,ct_data *tree,int max_code)

{
  ushort uVar1;
  ulg uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  int val_7;
  int len_7;
  int val_6;
  int len_6;
  int val_5;
  int len_5;
  int val_4;
  int len_4;
  int val_3;
  int len_3;
  int val_2;
  int len_2;
  int val_1;
  int len_1;
  int val;
  int len;
  int min_count;
  int max_count;
  int count;
  int nextlen;
  int curlen;
  int prevlen;
  int n;
  int max_code_local;
  ct_data *tree_local;
  deflate_state *s_local;
  
  nextlen = -1;
  min_count = 0;
  len = 7;
  val = 4;
  if ((tree->dl).dad == 0) {
    len = 0x8a;
    val = 3;
  }
  max_count = (uint)(tree->dl).dad;
  for (curlen = 0; curlen <= max_code; curlen = curlen + 1) {
    uVar3 = (uint)tree[curlen + 1].dl.dad;
    iVar4 = min_count + 1;
    if ((len <= iVar4) || (max_count != uVar3)) {
      if (iVar4 < val) {
        do {
          min_count = iVar4;
          uVar5 = (uint)s->bl_tree[max_count].dl.dad;
          if ((int)(0x10 - uVar5) < s->bi_valid) {
            uVar1 = s->bl_tree[max_count].fc.freq;
            s->bi_buf = s->bi_buf | uVar1 << ((byte)s->bi_valid & 0x1f);
            uVar2 = s->pending;
            s->pending = uVar2 + 1;
            s->pending_buf[uVar2] = (Bytef)s->bi_buf;
            uVar2 = s->pending;
            s->pending = uVar2 + 1;
            s->pending_buf[uVar2] = (Bytef)(s->bi_buf >> 8);
            s->bi_buf = (ush)((int)(uint)uVar1 >> (0x10U - (char)s->bi_valid & 0x1f));
            s->bi_valid = (uVar5 - 0x10) + s->bi_valid;
          }
          else {
            s->bi_buf = s->bi_buf | s->bl_tree[max_count].fc.freq << ((byte)s->bi_valid & 0x1f);
            s->bi_valid = uVar5 + s->bi_valid;
          }
          iVar4 = min_count + -1;
        } while (min_count + -1 != 0);
      }
      else if (max_count == 0) {
        if (iVar4 < 0xb) {
          uVar5 = (uint)s->bl_tree[0x11].dl.dad;
          if ((int)(0x10 - uVar5) < s->bi_valid) {
            uVar1 = s->bl_tree[0x11].fc.freq;
            s->bi_buf = s->bi_buf | uVar1 << ((byte)s->bi_valid & 0x1f);
            uVar2 = s->pending;
            s->pending = uVar2 + 1;
            s->pending_buf[uVar2] = (Bytef)s->bi_buf;
            uVar2 = s->pending;
            s->pending = uVar2 + 1;
            s->pending_buf[uVar2] = (Bytef)(s->bi_buf >> 8);
            s->bi_buf = (ush)((int)(uint)uVar1 >> (0x10U - (char)s->bi_valid & 0x1f));
            s->bi_valid = (uVar5 - 0x10) + s->bi_valid;
          }
          else {
            s->bi_buf = s->bi_buf | s->bl_tree[0x11].fc.freq << ((byte)s->bi_valid & 0x1f);
            s->bi_valid = uVar5 + s->bi_valid;
          }
          if (s->bi_valid < 0xe) {
            s->bi_buf = s->bi_buf |
                        (ushort)((min_count - 2U & 0xffff) << ((byte)s->bi_valid & 0x1f));
            s->bi_valid = s->bi_valid + 3;
          }
          else {
            s->bi_buf = s->bi_buf |
                        (ushort)((min_count - 2U & 0xffff) << ((byte)s->bi_valid & 0x1f));
            uVar2 = s->pending;
            s->pending = uVar2 + 1;
            s->pending_buf[uVar2] = (Bytef)s->bi_buf;
            uVar2 = s->pending;
            s->pending = uVar2 + 1;
            s->pending_buf[uVar2] = (Bytef)(s->bi_buf >> 8);
            s->bi_buf = (ush)((int)(min_count - 2U & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
            s->bi_valid = s->bi_valid + -0xd;
          }
        }
        else {
          uVar5 = (uint)s->bl_tree[0x12].dl.dad;
          if ((int)(0x10 - uVar5) < s->bi_valid) {
            uVar1 = s->bl_tree[0x12].fc.freq;
            s->bi_buf = s->bi_buf | uVar1 << ((byte)s->bi_valid & 0x1f);
            uVar2 = s->pending;
            s->pending = uVar2 + 1;
            s->pending_buf[uVar2] = (Bytef)s->bi_buf;
            uVar2 = s->pending;
            s->pending = uVar2 + 1;
            s->pending_buf[uVar2] = (Bytef)(s->bi_buf >> 8);
            s->bi_buf = (ush)((int)(uint)uVar1 >> (0x10U - (char)s->bi_valid & 0x1f));
            s->bi_valid = (uVar5 - 0x10) + s->bi_valid;
          }
          else {
            s->bi_buf = s->bi_buf | s->bl_tree[0x12].fc.freq << ((byte)s->bi_valid & 0x1f);
            s->bi_valid = uVar5 + s->bi_valid;
          }
          if (s->bi_valid < 10) {
            s->bi_buf = s->bi_buf |
                        (ushort)((min_count - 10U & 0xffff) << ((byte)s->bi_valid & 0x1f));
            s->bi_valid = s->bi_valid + 7;
          }
          else {
            s->bi_buf = s->bi_buf |
                        (ushort)((min_count - 10U & 0xffff) << ((byte)s->bi_valid & 0x1f));
            uVar2 = s->pending;
            s->pending = uVar2 + 1;
            s->pending_buf[uVar2] = (Bytef)s->bi_buf;
            uVar2 = s->pending;
            s->pending = uVar2 + 1;
            s->pending_buf[uVar2] = (Bytef)(s->bi_buf >> 8);
            s->bi_buf = (ush)((int)(min_count - 10U & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f))
            ;
            s->bi_valid = s->bi_valid + -9;
          }
        }
      }
      else {
        if (max_count != nextlen) {
          uVar5 = (uint)s->bl_tree[max_count].dl.dad;
          iVar4 = min_count;
          if ((int)(0x10 - uVar5) < s->bi_valid) {
            uVar1 = s->bl_tree[max_count].fc.freq;
            s->bi_buf = s->bi_buf | uVar1 << ((byte)s->bi_valid & 0x1f);
            uVar2 = s->pending;
            s->pending = uVar2 + 1;
            s->pending_buf[uVar2] = (Bytef)s->bi_buf;
            uVar2 = s->pending;
            s->pending = uVar2 + 1;
            s->pending_buf[uVar2] = (Bytef)(s->bi_buf >> 8);
            s->bi_buf = (ush)((int)(uint)uVar1 >> (0x10U - (char)s->bi_valid & 0x1f));
            s->bi_valid = (uVar5 - 0x10) + s->bi_valid;
          }
          else {
            s->bi_buf = s->bi_buf | s->bl_tree[max_count].fc.freq << ((byte)s->bi_valid & 0x1f);
            s->bi_valid = uVar5 + s->bi_valid;
          }
        }
        min_count = iVar4;
        uVar5 = (uint)s->bl_tree[0x10].dl.dad;
        if ((int)(0x10 - uVar5) < s->bi_valid) {
          uVar1 = s->bl_tree[0x10].fc.freq;
          s->bi_buf = s->bi_buf | uVar1 << ((byte)s->bi_valid & 0x1f);
          uVar2 = s->pending;
          s->pending = uVar2 + 1;
          s->pending_buf[uVar2] = (Bytef)s->bi_buf;
          uVar2 = s->pending;
          s->pending = uVar2 + 1;
          s->pending_buf[uVar2] = (Bytef)(s->bi_buf >> 8);
          s->bi_buf = (ush)((int)(uint)uVar1 >> (0x10U - (char)s->bi_valid & 0x1f));
          s->bi_valid = (uVar5 - 0x10) + s->bi_valid;
        }
        else {
          s->bi_buf = s->bi_buf | s->bl_tree[0x10].fc.freq << ((byte)s->bi_valid & 0x1f);
          s->bi_valid = uVar5 + s->bi_valid;
        }
        if (s->bi_valid < 0xf) {
          s->bi_buf = s->bi_buf | (ushort)((min_count - 3U & 0xffff) << ((byte)s->bi_valid & 0x1f));
          s->bi_valid = s->bi_valid + 2;
        }
        else {
          s->bi_buf = s->bi_buf | (ushort)((min_count - 3U & 0xffff) << ((byte)s->bi_valid & 0x1f));
          uVar2 = s->pending;
          s->pending = uVar2 + 1;
          s->pending_buf[uVar2] = (Bytef)s->bi_buf;
          uVar2 = s->pending;
          s->pending = uVar2 + 1;
          s->pending_buf[uVar2] = (Bytef)(s->bi_buf >> 8);
          s->bi_buf = (ush)((int)(min_count - 3U & 0xffff) >> (0x10U - (char)s->bi_valid & 0x1f));
          s->bi_valid = s->bi_valid + -0xe;
        }
      }
      min_count = 0;
      nextlen = max_count;
      iVar4 = min_count;
      if (uVar3 == 0) {
        len = 0x8a;
        val = 3;
      }
      else if (max_count == uVar3) {
        len = 6;
        val = 3;
      }
      else {
        len = 7;
        val = 4;
      }
    }
    min_count = iVar4;
    max_count = uVar3;
  }
  return;
}

Assistant:

local void send_tree(deflate_state *s, ct_data *tree, int max_code) {
    int n;                     /* iterates over all tree elements */
    int prevlen = -1;          /* last emitted length */
    int curlen;                /* length of current code */
    int nextlen = tree[0].Len; /* length of next code */
    int count = 0;             /* repeat count of the current code */
    int max_count = 7;         /* max repeat count */
    int min_count = 4;         /* min repeat count */

    /* tree[max_code + 1].Len = -1; */  /* guard already set */
    if (nextlen == 0) max_count = 138, min_count = 3;

    for (n = 0; n <= max_code; n++) {
        curlen = nextlen; nextlen = tree[n + 1].Len;
        if (++count < max_count && curlen == nextlen) {
            continue;
        } else if (count < min_count) {
            do { send_code(s, curlen, s->bl_tree); } while (--count != 0);

        } else if (curlen != 0) {
            if (curlen != prevlen) {
                send_code(s, curlen, s->bl_tree); count--;
            }
            Assert(count >= 3 && count <= 6, " 3_6?");
            send_code(s, REP_3_6, s->bl_tree); send_bits(s, count - 3, 2);

        } else if (count <= 10) {
            send_code(s, REPZ_3_10, s->bl_tree); send_bits(s, count - 3, 3);

        } else {
            send_code(s, REPZ_11_138, s->bl_tree); send_bits(s, count - 11, 7);
        }
        count = 0; prevlen = curlen;
        if (nextlen == 0) {
            max_count = 138, min_count = 3;
        } else if (curlen == nextlen) {
            max_count = 6, min_count = 3;
        } else {
            max_count = 7, min_count = 4;
        }
    }
}